

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

date_t duckdb::TimeBucket::OffsetTernaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts,interval_t offset)

{
  interval_t offset_00;
  interval_t bucket_width_00;
  interval_t offset_01;
  interval_t bucket_width_01;
  interval_t bucket_width_02;
  BucketWidthType BVar1;
  NotImplementedException *this;
  int64_t in_RCX;
  date_t in_EDX;
  int64_t in_RSI;
  int64_t in_RDI;
  int64_t in_R8;
  BucketWidthType bucket_width_type;
  allocator local_b9;
  string local_b8 [32];
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  int32_t local_4;
  
  bucket_width_02.micros = in_R8;
  bucket_width_02._0_8_ = in_RCX;
  BVar1 = ClassifyBucketWidthErrorThrow(bucket_width_02);
  if (BVar1 == CONVERTIBLE_TO_MICROS) {
    bucket_width_01.days = in_EDX.days;
    bucket_width_01.months = in_stack_ffffffffffffffa0;
    bucket_width_01.micros = in_RDI;
    offset_01.micros = in_RCX;
    offset_01.months = (int)in_stack_ffffffffffffff88;
    offset_01.days = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    local_4 = (int32_t)OffsetWidthConvertibleToMicrosTernaryOperator::
                       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                                 (bucket_width_01,(date_t)(int32_t)((ulong)in_R8 >> 0x20),offset_01)
    ;
  }
  else {
    if (BVar1 != CONVERTIBLE_TO_MONTHS) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"Bucket type not implemented for TIME_BUCKET",&local_b9)
      ;
      duckdb::NotImplementedException::NotImplementedException(this,local_b8);
      __cxa_throw(this,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    bucket_width_00.micros = in_RSI;
    bucket_width_00._0_8_ = in_RDI;
    offset_00.micros = in_R8;
    offset_00.months = (int)in_RCX;
    offset_00.days = (int)((ulong)in_RCX >> 0x20);
    local_4 = (int32_t)OffsetWidthConvertibleToMonthsTernaryOperator::
                       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                                 (bucket_width_00,in_EDX,offset_00);
  }
  return (date_t)local_4;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return OffsetWidthConvertibleToMicrosTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                offset);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return OffsetWidthConvertibleToMonthsTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                offset);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}